

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attribute_quantization_transform.cc
# Opt level: O2

bool __thiscall
draco::AttributeQuantizationTransform::InitFromAttribute
          (AttributeQuantizationTransform *this,PointAttribute *attribute)

{
  byte bVar1;
  AttributeTransformData *pAVar2;
  pointer pfVar3;
  bool bVar4;
  int i;
  ulong uVar5;
  
  pAVar2 = (attribute->attribute_transform_data_)._M_t.
           super___uniq_ptr_impl<draco::AttributeTransformData,_std::default_delete<draco::AttributeTransformData>_>
           ._M_t.
           super__Tuple_impl<0UL,_draco::AttributeTransformData_*,_std::default_delete<draco::AttributeTransformData>_>
           .super__Head_base<0UL,_draco::AttributeTransformData_*,_false>._M_head_impl;
  if ((pAVar2 == (AttributeTransformData *)0x0) ||
     (pAVar2->transform_type_ != ATTRIBUTE_QUANTIZATION_TRANSFORM)) {
    bVar4 = false;
  }
  else {
    this->quantization_bits_ =
         **(int32_t **)
           &(pAVar2->buffer_).data_.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>;
    std::vector<float,_std::allocator<float>_>::resize
              (&this->min_values_,(ulong)(attribute->super_GeometryAttribute).num_components_);
    bVar1 = (attribute->super_GeometryAttribute).num_components_;
    pfVar3 = (this->min_values_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (uVar5 = 0; bVar1 != uVar5; uVar5 = uVar5 + 1) {
      pfVar3[uVar5] =
           *(float *)(*(long *)&(pAVar2->buffer_).data_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_> +
                      4 + uVar5 * 4);
    }
    this->range_ = *(float *)(*(long *)&(pAVar2->buffer_).data_.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                              + 4 + uVar5 * 4);
    bVar4 = true;
  }
  return bVar4;
}

Assistant:

bool AttributeQuantizationTransform::EncodeParameters(
    EncoderBuffer *encoder_buffer) const {
  if (is_initialized()) {
    encoder_buffer->Encode(min_values_.data(),
                           sizeof(float) * min_values_.size());
    encoder_buffer->Encode(range_);
    encoder_buffer->Encode(static_cast<uint8_t>(quantization_bits_));
    return true;
  }
  return false;
}